

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O3

void read_pred_weight_table(h264_stream_t *h,bs_t *b)

{
  sps_t *psVar1;
  slice_header_t *psVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  byte *pbVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  bool bVar16;
  
  psVar1 = h->sps;
  psVar2 = h->sh;
  pbVar11 = b->p;
  pbVar3 = b->end;
  uVar12 = b->bits_left;
  uVar4 = 0xffffffff;
  iVar13 = 0;
  do {
    uVar12 = uVar12 - 1;
    b->bits_left = uVar12;
    bVar16 = true;
    if (pbVar11 < pbVar3) {
      bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
    }
    if (uVar12 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar12 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar13 = iVar13 + -1;
  } while (((bool)(bVar16 & uVar4 < 0x20)) && (pbVar11 < pbVar3));
  if (iVar13 == -1) {
    uVar4 = 0;
  }
  else {
    iVar5 = -2 - iVar13;
    iVar7 = -3 - iVar13;
    uVar4 = 0;
    do {
      uVar12 = uVar12 - 1;
      b->bits_left = uVar12;
      uVar8 = 0;
      if (pbVar11 < pbVar3) {
        uVar8 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
      }
      if (uVar12 == 0) {
        pbVar11 = pbVar11 + 1;
        b->p = pbVar11;
        b->bits_left = 8;
        uVar12 = 8;
      }
      uVar4 = uVar4 | uVar8 << ((byte)iVar5 & 0x1f);
      iVar7 = iVar7 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar7 != -2);
  }
  uVar8 = 0xffffffff;
  (psVar2->pwt).luma_log2_weight_denom = ~(-1 << (~(byte)iVar13 & 0x1f)) + uVar4;
  if (psVar1->ChromaArrayType != 0) {
    iVar13 = 0;
    do {
      uVar12 = uVar12 - 1;
      b->bits_left = uVar12;
      bVar16 = true;
      if (pbVar11 < pbVar3) {
        bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
      }
      if (uVar12 == 0) {
        pbVar11 = pbVar11 + 1;
        b->p = pbVar11;
        b->bits_left = 8;
        uVar12 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar13 = iVar13 + -1;
    } while (((bool)(bVar16 & uVar8 < 0x20)) && (pbVar11 < pbVar3));
    if (iVar13 == -1) {
      uVar4 = 0;
    }
    else {
      iVar5 = -2 - iVar13;
      iVar7 = -3 - iVar13;
      uVar4 = 0;
      do {
        uVar12 = uVar12 - 1;
        b->bits_left = uVar12;
        uVar8 = 0;
        if (pbVar11 < pbVar3) {
          uVar8 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
        }
        if (uVar12 == 0) {
          pbVar11 = pbVar11 + 1;
          b->p = pbVar11;
          b->bits_left = 8;
          uVar12 = 8;
        }
        uVar4 = uVar4 | uVar8 << ((byte)iVar5 & 0x1f);
        iVar7 = iVar7 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar7 != -2);
    }
    (psVar2->pwt).chroma_log2_weight_denom = ~(-1 << (~(byte)iVar13 & 0x1f)) + uVar4;
  }
  iVar13 = psVar2->num_ref_idx_l0_active_minus1;
  if (-1 < iVar13) {
    lVar9 = 0;
    do {
      uVar4 = b->bits_left - 1;
      b->bits_left = uVar4;
      uVar12 = 0;
      if (pbVar11 < pbVar3) {
        uVar12 = (uint)((*pbVar11 >> (uVar4 & 0x1f) & 1) != 0);
      }
      if (uVar4 == 0) {
        pbVar11 = pbVar11 + 1;
        b->p = pbVar11;
        b->bits_left = 8;
      }
      (psVar2->pwt).luma_weight_l0_flag[lVar9] = uVar12;
      if (uVar12 != 0) {
        uVar12 = b->bits_left;
        uVar4 = 0xffffffff;
        iVar5 = -2;
        do {
          iVar7 = iVar5;
          uVar8 = uVar4;
          uVar12 = uVar12 - 1;
          b->bits_left = uVar12;
          bVar16 = true;
          if (pbVar11 < pbVar3) {
            bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
          }
          if (uVar12 == 0) {
            pbVar11 = pbVar11 + 1;
            b->p = pbVar11;
            b->bits_left = 8;
            uVar12 = 8;
          }
          uVar4 = uVar8 + 1;
        } while (((bool)(bVar16 & uVar4 < 0x20)) && (iVar5 = iVar7 + 1, pbVar11 < pbVar3));
        uVar14 = 0;
        if (uVar4 != 0) {
          do {
            uVar12 = uVar12 - 1;
            b->bits_left = uVar12;
            uVar6 = 0;
            if (pbVar11 < pbVar3) {
              uVar6 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
            }
            if (uVar12 == 0) {
              pbVar11 = pbVar11 + 1;
              b->p = pbVar11;
              b->bits_left = 8;
              uVar12 = 8;
            }
            uVar14 = uVar14 | uVar6 << ((byte)uVar8 & 0x1f);
            uVar8 = uVar8 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        uVar4 = -1 << ((byte)uVar4 & 0x1f);
        uVar12 = ~uVar4 + uVar14;
        iVar5 = -((int)uVar12 >> 1);
        if ((uVar12 & 1) != 0) {
          iVar5 = (int)(uVar14 - uVar4) >> 1;
        }
        (psVar2->pwt).luma_weight_l0[lVar9] = iVar5;
        uVar12 = b->bits_left;
        uVar4 = 0xffffffff;
        iVar5 = -2;
        do {
          iVar7 = iVar5;
          uVar8 = uVar4;
          uVar12 = uVar12 - 1;
          b->bits_left = uVar12;
          bVar16 = true;
          if (pbVar11 < pbVar3) {
            bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
          }
          if (uVar12 == 0) {
            pbVar11 = pbVar11 + 1;
            b->p = pbVar11;
            b->bits_left = 8;
            uVar12 = 8;
          }
          uVar4 = uVar8 + 1;
        } while (((bool)(bVar16 & uVar4 < 0x20)) && (iVar5 = iVar7 + 1, pbVar11 < pbVar3));
        uVar14 = 0;
        if (uVar4 != 0) {
          do {
            uVar12 = uVar12 - 1;
            b->bits_left = uVar12;
            uVar6 = 0;
            if (pbVar11 < pbVar3) {
              uVar6 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
            }
            if (uVar12 == 0) {
              pbVar11 = pbVar11 + 1;
              b->p = pbVar11;
              b->bits_left = 8;
              uVar12 = 8;
            }
            uVar14 = uVar14 | uVar6 << ((byte)uVar8 & 0x1f);
            uVar8 = uVar8 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        uVar4 = -1 << ((byte)uVar4 & 0x1f);
        uVar12 = ~uVar4 + uVar14;
        iVar5 = -((int)uVar12 >> 1);
        if ((uVar12 & 1) != 0) {
          iVar5 = (int)(uVar14 - uVar4) >> 1;
        }
        (psVar2->pwt).luma_offset_l0[lVar9] = iVar5;
      }
      if (psVar1->ChromaArrayType != 0) {
        uVar4 = b->bits_left - 1;
        b->bits_left = uVar4;
        uVar12 = 0;
        if (pbVar11 < pbVar3) {
          uVar12 = (uint)((*pbVar11 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar11 = pbVar11 + 1;
          b->p = pbVar11;
          b->bits_left = 8;
        }
        (psVar2->pwt).chroma_weight_l0_flag[lVar9] = uVar12;
        if (uVar12 != 0) {
          lVar15 = 0;
          bVar16 = true;
          do {
            bVar10 = bVar16;
            uVar12 = b->bits_left;
            uVar4 = 0xffffffff;
            iVar13 = -2;
            do {
              iVar5 = iVar13;
              uVar8 = uVar4;
              uVar12 = uVar12 - 1;
              b->bits_left = uVar12;
              bVar16 = true;
              if (pbVar11 < pbVar3) {
                bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
              }
              if (uVar12 == 0) {
                pbVar11 = pbVar11 + 1;
                b->p = pbVar11;
                b->bits_left = 8;
                uVar12 = 8;
              }
              uVar4 = uVar8 + 1;
            } while (((bool)(bVar16 & uVar4 < 0x20)) && (iVar13 = iVar5 + 1, pbVar11 < pbVar3));
            uVar14 = 0;
            if (uVar4 != 0) {
              do {
                uVar12 = uVar12 - 1;
                b->bits_left = uVar12;
                uVar6 = 0;
                if (pbVar11 < pbVar3) {
                  uVar6 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
                }
                if (uVar12 == 0) {
                  pbVar11 = pbVar11 + 1;
                  b->p = pbVar11;
                  b->bits_left = 8;
                  uVar12 = 8;
                }
                uVar14 = uVar14 | uVar6 << ((byte)uVar8 & 0x1f);
                uVar8 = uVar8 - 1;
                iVar5 = iVar5 + -1;
              } while (iVar5 != -2);
            }
            uVar4 = -1 << ((byte)uVar4 & 0x1f);
            uVar12 = ~uVar4 + uVar14;
            iVar13 = -((int)uVar12 >> 1);
            if ((uVar12 & 1) != 0) {
              iVar13 = (int)(uVar14 - uVar4) >> 1;
            }
            (psVar2->pwt).chroma_weight_l0[lVar9][lVar15] = iVar13;
            uVar12 = b->bits_left;
            uVar4 = 0xffffffff;
            iVar13 = -2;
            do {
              iVar5 = iVar13;
              uVar8 = uVar4;
              uVar12 = uVar12 - 1;
              b->bits_left = uVar12;
              bVar16 = true;
              if (pbVar11 < pbVar3) {
                bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
              }
              if (uVar12 == 0) {
                pbVar11 = pbVar11 + 1;
                b->p = pbVar11;
                b->bits_left = 8;
                uVar12 = 8;
              }
              uVar4 = uVar8 + 1;
            } while (((bool)(bVar16 & uVar4 < 0x20)) && (iVar13 = iVar5 + 1, pbVar11 < pbVar3));
            uVar14 = 0;
            if (uVar4 != 0) {
              do {
                uVar12 = uVar12 - 1;
                b->bits_left = uVar12;
                uVar6 = 0;
                if (pbVar11 < pbVar3) {
                  uVar6 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
                }
                if (uVar12 == 0) {
                  pbVar11 = pbVar11 + 1;
                  b->p = pbVar11;
                  b->bits_left = 8;
                  uVar12 = 8;
                }
                uVar14 = uVar14 | uVar6 << ((byte)uVar8 & 0x1f);
                uVar8 = uVar8 - 1;
                iVar5 = iVar5 + -1;
              } while (iVar5 != -2);
            }
            uVar4 = -1 << ((byte)uVar4 & 0x1f);
            uVar12 = ~uVar4 + uVar14;
            iVar13 = -((int)uVar12 >> 1);
            if ((uVar12 & 1) != 0) {
              iVar13 = (int)(uVar14 - uVar4) >> 1;
            }
            (psVar2->pwt).chroma_offset_l0[lVar9][lVar15] = iVar13;
            lVar15 = 1;
            bVar16 = false;
          } while (bVar10);
          iVar13 = psVar2->num_ref_idx_l0_active_minus1;
        }
      }
      bVar16 = lVar9 < iVar13;
      lVar9 = lVar9 + 1;
    } while (bVar16);
  }
  iVar13 = psVar2->slice_type;
  iVar5 = iVar13 + -5;
  if (iVar13 < 5) {
    iVar5 = iVar13;
  }
  if ((iVar5 == 1) && (iVar13 = psVar2->num_ref_idx_l1_active_minus1, -1 < iVar13)) {
    lVar9 = 0;
    do {
      uVar4 = b->bits_left - 1;
      b->bits_left = uVar4;
      uVar12 = 0;
      if (pbVar11 < pbVar3) {
        uVar12 = (uint)((*pbVar11 >> (uVar4 & 0x1f) & 1) != 0);
      }
      if (uVar4 == 0) {
        pbVar11 = pbVar11 + 1;
        b->p = pbVar11;
        b->bits_left = 8;
      }
      (psVar2->pwt).luma_weight_l1_flag[lVar9] = uVar12;
      if (uVar12 != 0) {
        uVar12 = b->bits_left;
        uVar4 = 0xffffffff;
        iVar5 = -2;
        do {
          iVar7 = iVar5;
          uVar8 = uVar4;
          uVar12 = uVar12 - 1;
          b->bits_left = uVar12;
          bVar16 = true;
          if (pbVar11 < pbVar3) {
            bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
          }
          if (uVar12 == 0) {
            pbVar11 = pbVar11 + 1;
            b->p = pbVar11;
            b->bits_left = 8;
            uVar12 = 8;
          }
          uVar4 = uVar8 + 1;
        } while (((bool)(bVar16 & uVar4 < 0x20)) && (iVar5 = iVar7 + 1, pbVar11 < pbVar3));
        uVar14 = 0;
        if (uVar4 != 0) {
          do {
            uVar12 = uVar12 - 1;
            b->bits_left = uVar12;
            uVar6 = 0;
            if (pbVar11 < pbVar3) {
              uVar6 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
            }
            if (uVar12 == 0) {
              pbVar11 = pbVar11 + 1;
              b->p = pbVar11;
              b->bits_left = 8;
              uVar12 = 8;
            }
            uVar14 = uVar14 | uVar6 << ((byte)uVar8 & 0x1f);
            uVar8 = uVar8 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        uVar4 = -1 << ((byte)uVar4 & 0x1f);
        uVar12 = ~uVar4 + uVar14;
        iVar5 = -((int)uVar12 >> 1);
        if ((uVar12 & 1) != 0) {
          iVar5 = (int)(uVar14 - uVar4) >> 1;
        }
        (psVar2->pwt).luma_weight_l1[lVar9] = iVar5;
        uVar12 = b->bits_left;
        uVar4 = 0xffffffff;
        iVar5 = -2;
        do {
          iVar7 = iVar5;
          uVar8 = uVar4;
          uVar12 = uVar12 - 1;
          b->bits_left = uVar12;
          bVar16 = true;
          if (pbVar11 < pbVar3) {
            bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
          }
          if (uVar12 == 0) {
            pbVar11 = pbVar11 + 1;
            b->p = pbVar11;
            b->bits_left = 8;
            uVar12 = 8;
          }
          uVar4 = uVar8 + 1;
        } while (((bool)(bVar16 & uVar4 < 0x20)) && (iVar5 = iVar7 + 1, pbVar11 < pbVar3));
        uVar14 = 0;
        if (uVar4 != 0) {
          do {
            uVar12 = uVar12 - 1;
            b->bits_left = uVar12;
            uVar6 = 0;
            if (pbVar11 < pbVar3) {
              uVar6 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
            }
            if (uVar12 == 0) {
              pbVar11 = pbVar11 + 1;
              b->p = pbVar11;
              b->bits_left = 8;
              uVar12 = 8;
            }
            uVar14 = uVar14 | uVar6 << ((byte)uVar8 & 0x1f);
            uVar8 = uVar8 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        uVar4 = -1 << ((byte)uVar4 & 0x1f);
        uVar12 = ~uVar4 + uVar14;
        iVar5 = -((int)uVar12 >> 1);
        if ((uVar12 & 1) != 0) {
          iVar5 = (int)(uVar14 - uVar4) >> 1;
        }
        (psVar2->pwt).luma_offset_l1[lVar9] = iVar5;
      }
      if (psVar1->ChromaArrayType != 0) {
        uVar4 = b->bits_left - 1;
        b->bits_left = uVar4;
        uVar12 = 0;
        if (pbVar11 < pbVar3) {
          uVar12 = (uint)((*pbVar11 >> (uVar4 & 0x1f) & 1) != 0);
        }
        if (uVar4 == 0) {
          pbVar11 = pbVar11 + 1;
          b->p = pbVar11;
          b->bits_left = 8;
        }
        (psVar2->pwt).chroma_weight_l1_flag[lVar9] = uVar12;
        if (uVar12 != 0) {
          lVar15 = 0;
          bVar16 = true;
          do {
            bVar10 = bVar16;
            uVar12 = b->bits_left;
            uVar4 = 0xffffffff;
            iVar13 = -2;
            do {
              iVar5 = iVar13;
              uVar8 = uVar4;
              uVar12 = uVar12 - 1;
              b->bits_left = uVar12;
              bVar16 = true;
              if (pbVar11 < pbVar3) {
                bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
              }
              if (uVar12 == 0) {
                pbVar11 = pbVar11 + 1;
                b->p = pbVar11;
                b->bits_left = 8;
                uVar12 = 8;
              }
              uVar4 = uVar8 + 1;
            } while (((bool)(bVar16 & uVar4 < 0x20)) && (iVar13 = iVar5 + 1, pbVar11 < pbVar3));
            uVar14 = 0;
            if (uVar4 != 0) {
              do {
                uVar12 = uVar12 - 1;
                b->bits_left = uVar12;
                uVar6 = 0;
                if (pbVar11 < pbVar3) {
                  uVar6 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
                }
                if (uVar12 == 0) {
                  pbVar11 = pbVar11 + 1;
                  b->p = pbVar11;
                  b->bits_left = 8;
                  uVar12 = 8;
                }
                uVar14 = uVar14 | uVar6 << ((byte)uVar8 & 0x1f);
                uVar8 = uVar8 - 1;
                iVar5 = iVar5 + -1;
              } while (iVar5 != -2);
            }
            uVar4 = -1 << ((byte)uVar4 & 0x1f);
            uVar12 = ~uVar4 + uVar14;
            iVar13 = -((int)uVar12 >> 1);
            if ((uVar12 & 1) != 0) {
              iVar13 = (int)(uVar14 - uVar4) >> 1;
            }
            (psVar2->pwt).chroma_weight_l1[lVar9][lVar15] = iVar13;
            uVar12 = b->bits_left;
            uVar4 = 0xffffffff;
            iVar13 = -2;
            do {
              iVar5 = iVar13;
              uVar8 = uVar4;
              uVar12 = uVar12 - 1;
              b->bits_left = uVar12;
              bVar16 = true;
              if (pbVar11 < pbVar3) {
                bVar16 = (*pbVar11 >> (uVar12 & 0x1f) & 1) == 0;
              }
              if (uVar12 == 0) {
                pbVar11 = pbVar11 + 1;
                b->p = pbVar11;
                b->bits_left = 8;
                uVar12 = 8;
              }
              uVar4 = uVar8 + 1;
            } while (((bool)(bVar16 & uVar4 < 0x20)) && (iVar13 = iVar5 + 1, pbVar11 < pbVar3));
            uVar14 = 0;
            if (uVar4 != 0) {
              do {
                uVar12 = uVar12 - 1;
                b->bits_left = uVar12;
                uVar6 = 0;
                if (pbVar11 < pbVar3) {
                  uVar6 = (uint)((*pbVar11 >> (uVar12 & 0x1f) & 1) != 0);
                }
                if (uVar12 == 0) {
                  pbVar11 = pbVar11 + 1;
                  b->p = pbVar11;
                  b->bits_left = 8;
                  uVar12 = 8;
                }
                uVar14 = uVar14 | uVar6 << ((byte)uVar8 & 0x1f);
                uVar8 = uVar8 - 1;
                iVar5 = iVar5 + -1;
              } while (iVar5 != -2);
            }
            uVar4 = -1 << ((byte)uVar4 & 0x1f);
            uVar12 = ~uVar4 + uVar14;
            iVar13 = -((int)uVar12 >> 1);
            if ((uVar12 & 1) != 0) {
              iVar13 = (int)(uVar14 - uVar4) >> 1;
            }
            (psVar2->pwt).chroma_offset_l1[lVar9][lVar15] = iVar13;
            lVar15 = 1;
            bVar16 = false;
          } while (bVar10);
          iVar13 = psVar2->num_ref_idx_l1_active_minus1;
        }
      }
      bVar16 = lVar9 < iVar13;
      lVar9 = lVar9 + 1;
    } while (bVar16);
  }
  return;
}

Assistant:

void read_pred_weight_table(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    sps_t* sps = h->sps;
    pps_t* pps = h->pps;

    int i, j;

    sh->pwt.luma_log2_weight_denom = bs_read_ue(b);
    if( sps->ChromaArrayType != 0 )
    {
        sh->pwt.chroma_log2_weight_denom = bs_read_ue(b);
    }
    for( i = 0; i <= sh->num_ref_idx_l0_active_minus1; i++ )
    {
        sh->pwt.luma_weight_l0_flag[i] = bs_read_u1(b);
        if( sh->pwt.luma_weight_l0_flag[i] )
        {
            sh->pwt.luma_weight_l0[ i ] = bs_read_se(b);
            sh->pwt.luma_offset_l0[ i ] = bs_read_se(b);
        }
        if ( sps->ChromaArrayType != 0 )
        {
            sh->pwt.chroma_weight_l0_flag[i] = bs_read_u1(b);
            if( sh->pwt.chroma_weight_l0_flag[i] )
            {
                for( j =0; j < 2; j++ )
                {
                    sh->pwt.chroma_weight_l0[ i ][ j ] = bs_read_se(b);
                    sh->pwt.chroma_offset_l0[ i ][ j ] = bs_read_se(b);
                }
            }
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        for( i = 0; i <= sh->num_ref_idx_l1_active_minus1; i++ )
        {
            sh->pwt.luma_weight_l1_flag[i] = bs_read_u1(b);
            if( sh->pwt.luma_weight_l1_flag[i] )
            {
                sh->pwt.luma_weight_l1[ i ] = bs_read_se(b);
                sh->pwt.luma_offset_l1[ i ] = bs_read_se(b);
            }
            if( sps->ChromaArrayType != 0 )
            {
                sh->pwt.chroma_weight_l1_flag[i] = bs_read_u1(b);
                if( sh->pwt.chroma_weight_l1_flag[i] )
                {
                    for( j = 0; j < 2; j++ )
                    {
                        sh->pwt.chroma_weight_l1[ i ][ j ] = bs_read_se(b);
                        sh->pwt.chroma_offset_l1[ i ][ j ] = bs_read_se(b);
                    }
                }
            }
        }
    }
}